

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O2

png_fixed_point
png_muldiv_warn(png_const_structrp png_ptr,png_fixed_point a,png_int_32 times,png_int_32 divisor)

{
  int iVar1;
  png_fixed_point result;
  png_fixed_point local_c;
  
  iVar1 = png_muldiv(&local_c,a,times,divisor);
  if (iVar1 == 0) {
    png_warning(png_ptr,"fixed point overflow ignored");
    local_c = 0;
  }
  return local_c;
}

Assistant:

png_fixed_point
png_muldiv_warn(png_const_structrp png_ptr, png_fixed_point a, png_int_32 times,
    png_int_32 divisor)
{
   png_fixed_point result;

   if (png_muldiv(&result, a, times, divisor) != 0)
      return result;

   png_warning(png_ptr, "fixed point overflow ignored");
   return 0;
}